

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_decompose_char
          (utf8proc_int32_t uc,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  short sVar1;
  utf8proc_bool uVar2;
  int iVar3;
  utf8proc_property_t *puVar4;
  utf8proc_ssize_t uVar5;
  int tbc;
  utf8proc_bool boundary;
  utf8proc_int32_t hangul_tindex;
  utf8proc_int32_t hangul_sindex;
  utf8proc_propval_t category;
  utf8proc_property_t *property;
  int *last_boundclass_local;
  utf8proc_option_t options_local;
  utf8proc_ssize_t bufsize_local;
  utf8proc_int32_t *dst_local;
  utf8proc_ssize_t uStack_10;
  utf8proc_int32_t uc_local;
  
  if ((uc < 0) || (0x10ffff < uc)) {
    uStack_10 = -4;
  }
  else {
    puVar4 = unsafe_get_property(uc);
    sVar1 = puVar4->category;
    iVar3 = uc + -0xac00;
    if ((((options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) == 0) || (iVar3 < 0)) ||
       (0x2ba3 < iVar3)) {
      if (((options & UTF8PROC_REJECTNA) == 0) || (sVar1 != 0)) {
        if (((options & UTF8PROC_IGNORE) == 0) || ((*(ushort *)&puVar4->field_0x14 >> 2 & 1) == 0))
        {
          if (((options & UTF8PROC_STRIPNA) == 0) || (sVar1 != 0)) {
            if ((options & UTF8PROC_LUMP) != 0) {
              if (sVar1 == 0x17) {
                uVar5 = utf8proc_decompose_char
                                  (0x20,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if ((((uc == 0x2018) || (uc == 0x2019)) || (uc == 700)) || (uc == 0x2c8)) {
                uVar5 = utf8proc_decompose_char
                                  (0x27,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if ((sVar1 == 0xd) || (uc == 0x2212)) {
                uVar5 = utf8proc_decompose_char
                                  (0x2d,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if ((uc == 0x2044) || (uc == 0x2215)) {
                uVar5 = utf8proc_decompose_char
                                  (0x2f,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (uc == 0x2236) {
                uVar5 = utf8proc_decompose_char
                                  (0x3a,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (((uc == 0x2039) || (uc == 0x2329)) || (uc == 0x3008)) {
                uVar5 = utf8proc_decompose_char
                                  (0x3c,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (((uc == 0x203a) || (uc == 0x232a)) || (uc == 0x3009)) {
                uVar5 = utf8proc_decompose_char
                                  (0x3e,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (uc == 0x2216) {
                uVar5 = utf8proc_decompose_char
                                  (0x5c,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (((uc == 0x2c4) || (uc == 0x2c6)) || ((uc == 0x2038 || (uc == 0x2303)))) {
                uVar5 = utf8proc_decompose_char
                                  (0x5e,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if ((sVar1 == 0xc) || (uc == 0x2cd)) {
                uVar5 = utf8proc_decompose_char
                                  (0x5f,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (uc == 0x2cb) {
                uVar5 = utf8proc_decompose_char
                                  (0x60,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (uc == 0x2223) {
                uVar5 = utf8proc_decompose_char
                                  (0x7c,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if (uc == 0x223c) {
                uVar5 = utf8proc_decompose_char
                                  (0x7e,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
              if ((((options & UTF8PROC_NLF2LS) != 0) && ((options & UTF8PROC_NLF2PS) != 0)) &&
                 ((sVar1 == 0x18 || (sVar1 == 0x19)))) {
                uVar5 = utf8proc_decompose_char
                                  (10,dst,bufsize,options & ~UTF8PROC_LUMP,last_boundclass);
                return uVar5;
              }
            }
            if (((options & UTF8PROC_STRIPMARK) == 0) ||
               (((sVar1 != 6 && (sVar1 != 7)) && (sVar1 != 8)))) {
              if (((options & UTF8PROC_CASEFOLD) == 0) || (puVar4->casefold_seqindex == 0xffff)) {
                if (((options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) == 0) ||
                   ((puVar4->decomp_seqindex == 0xffff ||
                    ((puVar4->decomp_type != 0 && ((options & UTF8PROC_COMPAT) == 0)))))) {
                  if (((options & UTF8PROC_CHARBOUND) == 0) ||
                     (uVar2 = grapheme_break_extended
                                        (*last_boundclass,
                                         (uint)(*(ushort *)&puVar4->field_0x14 >> 8),last_boundclass
                                        ), !uVar2)) {
                    if (0 < bufsize) {
                      *dst = uc;
                    }
                    uStack_10 = 1;
                  }
                  else {
                    if (0 < bufsize) {
                      *dst = 0xffff;
                    }
                    if (1 < bufsize) {
                      dst[1] = uc;
                    }
                    uStack_10 = 2;
                  }
                }
                else {
                  uStack_10 = seqindex_write_char_decomposed
                                        (puVar4->decomp_seqindex,dst,bufsize,options,last_boundclass
                                        );
                }
              }
              else {
                uStack_10 = seqindex_write_char_decomposed
                                      (puVar4->casefold_seqindex,dst,bufsize,options,last_boundclass
                                      );
              }
            }
            else {
              uStack_10 = 0;
            }
          }
          else {
            uStack_10 = 0;
          }
        }
        else {
          uStack_10 = 0;
        }
      }
      else {
        uStack_10 = -4;
      }
    }
    else {
      if ((0 < bufsize) && (*dst = iVar3 / 0x24c + 0x1100, 1 < bufsize)) {
        dst[1] = (int)((long)((ulong)(uint)((int)((long)iVar3 % 0x24c) >> 0x1f) << 0x20 |
                             (long)iVar3 % 0x24c & 0xffffffffU) / 0x1c) + 0x1161;
      }
      if (iVar3 % 0x1c == 0) {
        uStack_10 = 2;
      }
      else {
        if (2 < bufsize) {
          dst[2] = iVar3 % 0x1c + 0x11a7;
        }
        uStack_10 = 3;
      }
    }
  }
  return uStack_10;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_char(utf8proc_int32_t uc, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  const utf8proc_property_t *property;
  utf8proc_propval_t category;
  utf8proc_int32_t hangul_sindex;
  if (uc < 0 || uc >= 0x110000) return UTF8PROC_ERROR_NOTASSIGNED;
  property = unsafe_get_property(uc);
  category = property->category;
  hangul_sindex = uc - UTF8PROC_HANGUL_SBASE;
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT) {
      utf8proc_int32_t hangul_tindex;
      if (bufsize >= 1) {
        dst[0] = UTF8PROC_HANGUL_LBASE +
          hangul_sindex / UTF8PROC_HANGUL_NCOUNT;
        if (bufsize >= 2) dst[1] = UTF8PROC_HANGUL_VBASE +
          (hangul_sindex % UTF8PROC_HANGUL_NCOUNT) / UTF8PROC_HANGUL_TCOUNT;
      }
      hangul_tindex = hangul_sindex % UTF8PROC_HANGUL_TCOUNT;
      if (!hangul_tindex) return 2;
      if (bufsize >= 3) dst[2] = UTF8PROC_HANGUL_TBASE + hangul_tindex;
      return 3;
    }
  }
  if (options & UTF8PROC_REJECTNA) {
    if (!category) return UTF8PROC_ERROR_NOTASSIGNED;
  }
  if (options & UTF8PROC_IGNORE) {
    if (property->ignorable) return 0;
  }
  if (options & UTF8PROC_STRIPNA) {
    if (!category) return 0;
  }
  if (options & UTF8PROC_LUMP) {
    if (category == UTF8PROC_CATEGORY_ZS) utf8proc_decompose_lump(0x0020);
    if (uc == 0x2018 || uc == 0x2019 || uc == 0x02BC || uc == 0x02C8)
      utf8proc_decompose_lump(0x0027);
    if (category == UTF8PROC_CATEGORY_PD || uc == 0x2212)
      utf8proc_decompose_lump(0x002D);
    if (uc == 0x2044 || uc == 0x2215) utf8proc_decompose_lump(0x002F);
    if (uc == 0x2236) utf8proc_decompose_lump(0x003A);
    if (uc == 0x2039 || uc == 0x2329 || uc == 0x3008)
      utf8proc_decompose_lump(0x003C);
    if (uc == 0x203A || uc == 0x232A || uc == 0x3009)
      utf8proc_decompose_lump(0x003E);
    if (uc == 0x2216) utf8proc_decompose_lump(0x005C);
    if (uc == 0x02C4 || uc == 0x02C6 || uc == 0x2038 || uc == 0x2303)
      utf8proc_decompose_lump(0x005E);
    if (category == UTF8PROC_CATEGORY_PC || uc == 0x02CD)
      utf8proc_decompose_lump(0x005F);
    if (uc == 0x02CB) utf8proc_decompose_lump(0x0060);
    if (uc == 0x2223) utf8proc_decompose_lump(0x007C);
    if (uc == 0x223C) utf8proc_decompose_lump(0x007E);
    if ((options & UTF8PROC_NLF2LS) && (options & UTF8PROC_NLF2PS)) {
      if (category == UTF8PROC_CATEGORY_ZL ||
          category == UTF8PROC_CATEGORY_ZP)
        utf8proc_decompose_lump(0x000A);
    }
  }
  if (options & UTF8PROC_STRIPMARK) {
    if (category == UTF8PROC_CATEGORY_MN ||
      category == UTF8PROC_CATEGORY_MC ||
      category == UTF8PROC_CATEGORY_ME) return 0;
  }
  if (options & UTF8PROC_CASEFOLD) {
    if (property->casefold_seqindex != UINT16_MAX) {
      return seqindex_write_char_decomposed(property->casefold_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (property->decomp_seqindex != UINT16_MAX &&
        (!property->decomp_type || (options & UTF8PROC_COMPAT))) {
      return seqindex_write_char_decomposed(property->decomp_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & UTF8PROC_CHARBOUND) {
    utf8proc_bool boundary;
    int tbc = property->boundclass;
    boundary = grapheme_break_extended(*last_boundclass, tbc, last_boundclass);
    if (boundary) {
      if (bufsize >= 1) dst[0] = 0xFFFF;
      if (bufsize >= 2) dst[1] = uc;
      return 2;
    }
  }
  if (bufsize >= 1) *dst = uc;
  return 1;
}